

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySingleValue::~IfcPropertySingleValue
          (IfcPropertySingleValue *this)

{
  ~IfcPropertySingleValue((IfcPropertySingleValue *)&this[-1].field_0x58);
  return;
}

Assistant:

IfcPropertySingleValue() : Object("IfcPropertySingleValue") {}